

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O2

void __thiscall
Rml::GeometryBackgroundBorder::DrawArc
          (GeometryBackgroundBorder *this,Vector2f pos_center,Vector2f r,float a0,float a1,
          ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ColourbPremultiplied CVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float t;
  float local_68;
  float fStack_64;
  
  if (((num_points < 2) || (r.x <= 0.0)) || (r.y <= 0.0)) {
    bVar2 = Assert("RMLUI_ASSERT(num_points >= 2 && r.x > 0 && r.y > 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,0xb9);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = this->vertices;
  iVar3 = (int)(((long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x14);
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            (this_00,(long)(iVar3 + num_points));
  uVar6 = 0;
  uVar5 = (ulong)(uint)num_points;
  if (num_points < 1) {
    uVar5 = uVar6;
  }
  lVar7 = (long)iVar3 * 0x14;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    t = (float)(int)uVar6 / (float)(num_points + -1);
    fVar8 = (1.0 - t) * a0 + t * a1;
    fVar9 = Math::Cos(fVar8);
    fVar8 = Math::Sin(fVar8);
    local_68 = pos_center.x;
    fStack_64 = pos_center.y;
    *(ulong *)((long)&(((this->vertices->
                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                        super__Vector_impl_data._M_start)->position).x + lVar7) =
         CONCAT44(fVar8 * r.y + fStack_64,fVar9 * r.x + local_68);
    CVar4 = Math::RoundedLerp(t,color0,color1);
    *(ColourbPremultiplied *)
     ((long)&(((this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
               _M_impl.super__Vector_impl_data._M_start)->colour).red + lVar7) = CVar4;
    lVar7 = lVar7 + 0x14;
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArc(Vector2f pos_center, Vector2f r, float a0, float a1, ColourbPremultiplied color0, ColourbPremultiplied color1,
	int num_points)
{
	RMLUI_ASSERT(num_points >= 2 && r.x > 0 && r.y > 0);

	const int offset_vertices = (int)vertices.size();

	vertices.resize(offset_vertices + num_points);

	for (int i = 0; i < num_points; i++)
	{
		const float t = float(i) / float(num_points - 1);

		const float a = Math::Lerp(t, a0, a1);

		const Vector2f unit_vector(Math::Cos(a), Math::Sin(a));

		vertices[offset_vertices + i].position = unit_vector * r + pos_center;
		vertices[offset_vertices + i].colour = Math::RoundedLerp(t, color0, color1);
	}
}